

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::GenericInputFile::readMagicNumberAndVersionField
          (GenericInputFile *this,IStream *is,int *version)

{
  bool bVar1;
  int iVar2;
  InputExc *pIVar3;
  ostream *poVar4;
  int *in_RDX;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  int magic;
  int *in_stack_fffffffffffffc78;
  IStream *in_stack_fffffffffffffc80;
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [396];
  int local_1c;
  int *local_18;
  
  local_18 = in_RDX;
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78)
  ;
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78)
  ;
  if (local_1c != 0x1312f76) {
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar3,"File is not an image file.");
    __cxa_throw(pIVar3,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  iVar2 = getVersion(*local_18);
  if (iVar2 != 2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Cannot read version ");
    iVar2 = getVersion(*local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," image files.  Current file format version is ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    std::operator<<(poVar4,".");
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar3,local_1b8);
    __cxa_throw(pIVar3,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  iVar2 = getFlags(*local_18);
  bVar1 = supportsFlags(iVar2);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_340);
    std::operator<<(local_330,
                    "The file format version number\'s flag field contains unrecognized flags.");
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar3,local_340);
    __cxa_throw(pIVar3,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  return;
}

Assistant:

void
GenericInputFile::readMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int& version)
{
    //
    // Read the magic number and the file format version number.
    // Then check if we can read the rest of this file.
    //

    int magic;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, magic);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, version);

    if (magic != MAGIC)
    {
        throw IEX_NAMESPACE::InputExc ("File is not an image file.");
    }

    if (getVersion (version) != EXR_VERSION)
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Cannot read "
            "version "
                << getVersion (version)
                << " "
                   "image files.  Current file format version "
                   "is "
                << EXR_VERSION << ".");
    }

    if (!supportsFlags (getFlags (version)))
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "The file format version number's flag field "
            "contains unrecognized flags.");
    }
}